

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void golf_storage_init(void)

{
  return;
}

Assistant:

void golf_storage_init(void) {
#if GOLF_PLATFORM_ANDROID

    ANativeActivity *native_activity = sapp_android_get_native_activity();
    const char *internal_path = native_activity->internalDataPath;
    
    // Create the internal storage directory if it doesn't exist yet
    struct stat sb;
    int res = stat(internal_path, &sb); 
    if (!(0 == res && sb.st_mode & S_IFDIR)) {
        res = mkdir(internal_path, 0770);
    }

#elif GOLF_PLATFORM_IOS

    NSString *appSupportDir = [NSSearchPathForDirectoriesInDomains(NSApplicationSupportDirectory, NSUserDomainMask, YES) lastObject];

    // Create the application support directory if it doesn't exist yet
    if (![[NSFileManager defaultManager] fileExistsAtPath:appSupportDir isDirectory:NULL]) {
        NSError *error = nil;
        if (![[NSFileManager defaultManager] createDirectoryAtPath:appSupportDir withIntermediateDirectories:YES attributes:nil error:&error]) {
            NSLog(@"Error creating application suport directory: %@", error.localizedDescription);
        }
    }

#elif GOLF_PLATFORM_EMSCRIPTEN

    EM_ASM(
            FS.mkdir('/opengolf_persistent_data');
            FS.mount(IDBFS, {}, '/opengolf_persistent_data');
            Module.syncdone = 0;
            FS.syncfs(true, function(err) {
                assert(!err);
                Module.syncdone = 1;
                });
          );

#endif
}